

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O3

bool Imath_2_5::extractSHRT<float>
               (Matrix44<float> *mat,Vec3<float> *s,Vec3<float> *h,Vec3<float> *r,Vec3<float> *t,
               bool exc,Order rOrder)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  char cVar6;
  bool bVar7;
  Euler<float> e;
  int m [3];
  Euler<float> local_ac;
  Matrix33<float> local_9c;
  Euler<float> local_78;
  Matrix44<float> local_68;
  
  local_68.x[0]._0_8_ = *(undefined8 *)mat->x[0];
  local_68.x[0]._8_8_ = *(undefined8 *)(mat->x[0] + 2);
  local_68.x[1]._0_8_ = *(undefined8 *)mat->x[1];
  local_68.x[1]._8_8_ = *(undefined8 *)(mat->x[1] + 2);
  local_68.x[2]._0_8_ = *(undefined8 *)mat->x[2];
  local_68.x[2]._8_8_ = *(undefined8 *)(mat->x[2] + 2);
  local_68.x[3]._0_8_ = *(undefined8 *)mat->x[3];
  local_68.x[3]._8_8_ = *(undefined8 *)(mat->x[3] + 2);
  bVar3 = extractAndRemoveScalingAndShear<float>(&local_68,s,h,exc);
  if (bVar3) {
    extractEulerXYZ<float>(&local_68,r);
    t->x = mat->x[3][0];
    t->y = mat->x[3][1];
    t->z = mat->x[3][2];
    if (rOrder != Default) {
      local_78._12_1_ = 5;
      local_78.super_Vec3<float>.x = r->x;
      local_78.super_Vec3<float>.y = r->y;
      local_78.super_Vec3<float>.z = r->z;
      local_ac._12_1_ = 0x10;
      if ((rOrder >> 0xd & 1) == 0) {
        local_ac._12_1_ = (byte)(rOrder >> 9) & 8;
      }
      local_ac._12_1_ =
           (byte)rOrder >> 3 & 2 | (byte)(rOrder >> 6) & 4 | (byte)rOrder & 1 | local_ac._12_1_;
      Euler<float>::toMatrix33(&local_9c,&local_78);
      Euler<float>::extract(&local_ac,&local_9c);
      bVar4 = (byte)local_ac._12_1_ >> 3 & 3;
      local_9c.x[0][bVar4] = 0.0;
      bVar7 = (local_ac._12_1_ & 4) == 0;
      cVar6 = '\x01';
      if (1 < bVar4) {
        cVar6 = -2;
      }
      uVar5 = (ulong)(byte)(bVar4 - 1);
      if (bVar4 == 0) {
        uVar5 = 2;
      }
      local_9c.x[0][(byte)(cVar6 + bVar4)] = (float)(bVar7 + 1);
      local_9c.x[0][uVar5] = (float)(2 - (uint)bVar7);
      fVar1 = (&local_ac.super_Vec3<float>.x)[(int)local_9c.x[0][1]];
      fVar2 = (&local_ac.super_Vec3<float>.x)[(int)local_9c.x[0][2]];
      r->x = (&local_ac.super_Vec3<float>.x)[(int)local_9c.x[0][0]];
      r->y = fVar1;
      r->z = fVar2;
    }
  }
  return bVar3;
}

Assistant:

bool 
extractSHRT (const Matrix44<T> &mat,
	     Vec3<T> &s,
	     Vec3<T> &h,
	     Vec3<T> &r,
	     Vec3<T> &t,
	     bool exc /* = true */ ,
	     typename Euler<T>::Order rOrder /* = Euler<T>::XYZ */ )
{
    Matrix44<T> rot;

    rot = mat;
    if (! extractAndRemoveScalingAndShear (rot, s, h, exc))
	return false;

    extractEulerXYZ (rot, r);

    t.x = mat[3][0];
    t.y = mat[3][1];
    t.z = mat[3][2];

    if (rOrder != Euler<T>::XYZ)
    {
	IMATH_INTERNAL_NAMESPACE::Euler<T> eXYZ (r, IMATH_INTERNAL_NAMESPACE::Euler<T>::XYZ);
	IMATH_INTERNAL_NAMESPACE::Euler<T> e (eXYZ, rOrder);
	r = e.toXYZVector ();
    }

    return true;
}